

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O1

int WebPMemoryWrite(uint8_t *data,size_t data_size,WebPPicture *picture)

{
  long *plVar1;
  ulong uVar2;
  void *__dest;
  ulong uVar3;
  uint64_t nmemb;
  
  plVar1 = (long *)picture->custom_ptr;
  if (plVar1 != (long *)0x0) {
    uVar3 = plVar1[1] + data_size;
    if ((ulong)plVar1[2] < uVar3) {
      uVar2 = plVar1[2] * 2;
      if (uVar2 <= uVar3) {
        uVar2 = uVar3;
      }
      nmemb = 0x2000;
      if (0x2000 < uVar2) {
        nmemb = uVar2;
      }
      __dest = WebPSafeMalloc(nmemb,1);
      if (__dest == (void *)0x0) {
        return 0;
      }
      if (plVar1[1] != 0) {
        memcpy(__dest,(void *)*plVar1,plVar1[1]);
      }
      WebPSafeFree((void *)*plVar1);
      *plVar1 = (long)__dest;
      plVar1[2] = nmemb;
    }
    if (data_size != 0) {
      memcpy((void *)(*plVar1 + plVar1[1]),data,data_size);
      plVar1[1] = plVar1[1] + data_size;
    }
  }
  return 1;
}

Assistant:

int WebPMemoryWrite(const uint8_t* data, size_t data_size,
                    const WebPPicture* picture) {
  WebPMemoryWriter* const w = (WebPMemoryWriter*)picture->custom_ptr;
  uint64_t next_size;
  if (w == NULL) {
    return 1;
  }
  next_size = (uint64_t)w->size + data_size;
  if (next_size > w->max_size) {
    uint8_t* new_mem;
    uint64_t next_max_size = 2ULL * w->max_size;
    if (next_max_size < next_size) next_max_size = next_size;
    if (next_max_size < 8192ULL) next_max_size = 8192ULL;
    new_mem = (uint8_t*)WebPSafeMalloc(next_max_size, 1);
    if (new_mem == NULL) {
      return 0;
    }
    if (w->size > 0) {
      memcpy(new_mem, w->mem, w->size);
    }
    WebPSafeFree(w->mem);
    w->mem = new_mem;
    // down-cast is ok, thanks to WebPSafeMalloc
    w->max_size = (size_t)next_max_size;
  }
  if (data_size > 0) {
    memcpy(w->mem + w->size, data, data_size);
    w->size += data_size;
  }
  return 1;
}